

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callbacks.cpp
# Opt level: O0

IDeckLinkDeckControlStatusCallback *
cdecklink_internal_callback_create_deck_link_deck_control_status_callback
          (void *ctx,cdecklink_deck_control_status_callback_timecode_update *cb0,
          cdecklink_deck_control_status_callback_vtr_control_state_changed *cb1,
          cdecklink_deck_control_status_callback_deck_control_event_received *cb2,
          cdecklink_deck_control_status_callback_deck_control_status_changed *cb3)

{
  cdecklink_deck_control_status_callback_deck_control_status_changed *cb3_local;
  cdecklink_deck_control_status_callback_deck_control_event_received *cb2_local;
  cdecklink_deck_control_status_callback_vtr_control_state_changed *cb1_local;
  cdecklink_deck_control_status_callback_timecode_update *cb0_local;
  void *ctx_local;
  
  if ((((cb0 == (cdecklink_deck_control_status_callback_timecode_update *)0x0) &&
       (cb1 == (cdecklink_deck_control_status_callback_vtr_control_state_changed *)0x0)) &&
      (cb2 == (cdecklink_deck_control_status_callback_deck_control_event_received *)0x0)) &&
     (cb3 == (cdecklink_deck_control_status_callback_deck_control_status_changed *)0x0)) {
    ctx_local = (void *)0x0;
  }
  else {
    ctx_local = operator_new(0x38);
    DeckLinkDeckControlStatusCallback::DeckLinkDeckControlStatusCallback
              ((DeckLinkDeckControlStatusCallback *)ctx_local,ctx,cb0,cb1,cb2,cb3);
  }
  return (IDeckLinkDeckControlStatusCallback *)ctx_local;
}

Assistant:

IDeckLinkDeckControlStatusCallback* cdecklink_internal_callback_create_deck_link_deck_control_status_callback (void *ctx, cdecklink_deck_control_status_callback_timecode_update *cb0, cdecklink_deck_control_status_callback_vtr_control_state_changed *cb1, cdecklink_deck_control_status_callback_deck_control_event_received *cb2, cdecklink_deck_control_status_callback_deck_control_status_changed *cb3) {
	if (cb0 != nullptr || cb1 != nullptr || cb2 != nullptr || cb3 != nullptr) {
		return new DeckLinkDeckControlStatusCallback(ctx, cb0, cb1, cb2, cb3);
	}
	return nullptr;
}